

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O3

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Single_Quoted_String_
          (ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
           *this)

{
  Position *this_00;
  bool bVar1;
  char *pcVar2;
  eval_error *this_01;
  char *pcVar3;
  char cVar4;
  string local_48;
  File_Position local_28;
  
  pcVar2 = (this->m_position).m_pos;
  if ((pcVar2 == (this->m_position).m_end) || (*pcVar2 != '\'')) {
    return false;
  }
  this_00 = &this->m_position;
  Position::operator++(this_00);
  pcVar2 = (this->m_position).m_pos;
  if (pcVar2 != (this->m_position).m_end) {
    cVar4 = '\'';
    do {
      if ((*pcVar2 == '\'') && (cVar4 != '\\')) {
        Position::operator++(this_00);
        return true;
      }
      bVar1 = Eol_(this,false);
      if (!bVar1) {
        if (cVar4 == '\\') {
          cVar4 = '\0';
        }
        else {
          pcVar2 = (this->m_position).m_pos;
          pcVar3 = "";
          if (pcVar2 != (this->m_position).m_end) {
            pcVar3 = pcVar2;
          }
          cVar4 = *pcVar3;
        }
        Position::operator++(this_00);
      }
      pcVar2 = (this->m_position).m_pos;
    } while (pcVar2 != (this->m_position).m_end);
  }
  this_01 = (eval_error *)__cxa_allocate_exception(0x90);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Unclosed single-quoted string","");
  local_28.line = (this->m_position).line;
  local_28.column = (this->m_position).col;
  exception::eval_error::eval_error
            (this_01,&local_48,&local_28,
             (this->m_filename).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  __cxa_throw(this_01,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
}

Assistant:

constexpr bool has_more() const noexcept { return m_pos != m_end; }